

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

int recovery_test_nonce_function
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  if (counter == 1) {
    uVar8 = 0xffffffff;
    uVar5 = 0xffffffff;
    uVar6 = 0xffffffff;
    uVar7 = 0xffffffff;
  }
  else {
    if (counter != 0) {
      builtin_memcpy(nonce32,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                     ,0x20);
      lVar1 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
              secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar3 = secp256k1_test_state[1] << 0x11;
      uVar4 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar2 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar4;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar2;
      secp256k1_test_state[2] = uVar4 ^ uVar3;
      secp256k1_test_state[3] = uVar2 << 0x2d | uVar2 >> 0x13;
      return (int)((ulong)lVar1 >> 0x3f);
    }
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
  }
  *(undefined4 *)(nonce32 + 0x10) = uVar5;
  *(undefined4 *)(nonce32 + 0x14) = uVar6;
  *(undefined4 *)(nonce32 + 0x18) = uVar7;
  *(undefined4 *)(nonce32 + 0x1c) = uVar8;
  *(undefined4 *)nonce32 = uVar5;
  *(undefined4 *)(nonce32 + 4) = uVar6;
  *(undefined4 *)(nonce32 + 8) = uVar7;
  *(undefined4 *)(nonce32 + 0xc) = uVar8;
  return 1;
}

Assistant:

static int recovery_test_nonce_function(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
    (void) msg32;
    (void) key32;
    (void) algo16;
    (void) data;

    /* On the first run, return 0 to force a second run */
    if (counter == 0) {
        memset(nonce32, 0, 32);
        return 1;
    }
    /* On the second run, return an overflow to force a third run */
    if (counter == 1) {
        memset(nonce32, 0xff, 32);
        return 1;
    }
    /* On the next run, return a valid nonce, but flip a coin as to whether or not to fail signing. */
    memset(nonce32, 1, 32);
    return testrand_bits(1);
}